

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQClass::SQClass(SQClass *this,SQVM *v,SQClass *base)

{
  SQSharedState *pSVar1;
  SQUnsignedInteger SVar2;
  _func_int **pp_Var3;
  SQTable *pSVar4;
  SQUnsignedInteger in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  long in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger _n_;
  SQSharedState *ss;
  SQInteger in_stack_ffffffffffffff58;
  SQSharedState *in_stack_ffffffffffffff60;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQObjectPtr *in_stack_ffffffffffffff70;
  SQWeakRef **local_58;
  long local_38;
  
  SQCollectable::SQCollectable((SQCollectable *)in_stack_ffffffffffffff60);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQClass_0021be20;
  sqvector<SQClassMember,_unsigned_int>::sqvector
            ((sqvector<SQClassMember,_unsigned_int> *)&in_RDI[1].super_SQRefCounted._weakref,
             (SQAllocContext)**(undefined8 **)(in_RSI + 0x128));
  sqvector<SQClassMember,_unsigned_int>::sqvector
            ((sqvector<SQClassMember,_unsigned_int> *)&in_RDI[1]._sharedstate,
             (SQAllocContext)**(undefined8 **)(in_RSI + 0x128));
  local_58 = &in_RDI[2].super_SQRefCounted._weakref;
  pSVar4 = (SQTable *)(in_RDI + 8);
  do {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
    local_58 = local_58 + 2;
  } while ((SQTable *)local_58 != pSVar4);
  pSVar1 = *(SQSharedState **)(in_RSI + 0x128);
  in_RDI[1].super_SQRefCounted._uiRef = in_RDX;
  in_RDI[8].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  in_RDI[8].super_SQRefCounted._uiRef = 0;
  in_RDI[8]._gc_next = (SQCollectable_conflict *)0x0;
  in_RDI[8].super_SQRefCounted._weakref = (SQWeakRef *)0xffffffffffffffff;
  in_RDI[8]._gc_prev = (SQCollectable_conflict *)0x0;
  if (in_RDI[1].super_SQRefCounted._uiRef != 0) {
    in_RDI[8].super_SQRefCounted._weakref =
         *(SQWeakRef **)(in_RDI[1].super_SQRefCounted._uiRef + 400);
    in_RDI[8]._gc_next = *(SQCollectable_conflict **)(in_RDI[1].super_SQRefCounted._uiRef + 0x198);
    sqvector<SQClassMember,_unsigned_int>::copy
              ((sqvector<SQClassMember,_unsigned_int> *)&in_RDI[1].super_SQRefCounted._weakref,
               (EVP_PKEY_CTX *)(in_RDX + 0x40),src);
    sqvector<SQClassMember,_unsigned_int>::copy
              ((sqvector<SQClassMember,_unsigned_int> *)&in_RDI[1]._sharedstate,
               (EVP_PKEY_CTX *)(in_RDX + 0x58),src_00);
    for (local_38 = 0; local_38 < 0x11; local_38 = local_38 + 1) {
      ::SQObjectPtr::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    SVar2 = in_RDI[1].super_SQRefCounted._uiRef;
    *(long *)(SVar2 + 8) = *(long *)(SVar2 + 8) + 1;
  }
  if (in_RDX == 0) {
    pSVar4 = SQTable::Create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    pSVar4 = SQTable::Clone(pSVar4);
  }
  in_RDI[1].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)pSVar4;
  pp_Var3 = in_RDI[1].super_SQRefCounted._vptr_SQRefCounted;
  pp_Var3[1] = pp_Var3[1] + 1;
  in_RDI->_gc_next = (SQCollectable_conflict *)0x0;
  in_RDI->_gc_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = pSVar1;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQClass::SQClass(SQVM *v, SQClass *base) :
    _defaultvalues(_ss(v)->_alloc_ctx),
    _methods(_ss(v)->_alloc_ctx)
{
    SQSharedState *ss = _ss(v);

    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _constructoridx = -1;
    _lockedTypeId = 0;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_NUM_METHODS);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}